

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O2

void __thiscall CleanTestCleanDepFileOnCleanTarget::Run(CleanTestCleanDepFileOnCleanTarget *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Test *this_01;
  int iVar1;
  Cleaner cleaner;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string local_e8;
  Cleaner local_c8;
  
  iVar1 = g_current_test->assertion_failures_;
  state = &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,"rule cc\n  command = cc $in > $out\n  depfile = $out.d\nbuild out1: cc in1\n",
              (ManifestParserOptions)0x0);
  if (iVar1 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"out1",&local_e9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_ea);
    this_00 = &(this->super_CleanTest).fs_;
    VirtualFileSystem::Create(this_00,(string *)&local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"out1.d",&local_e9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_ea);
    VirtualFileSystem::Create(this_00,(string *)&local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    Cleaner::Cleaner(&local_c8,state,&(this->super_CleanTest).config_,&this_00->super_DiskInterface)
    ;
    this_01 = g_current_test;
    iVar1 = Cleaner::CleanTarget(&local_c8,"out1");
    testing::Test::Check
              (this_01,iVar1 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
               ,0x10c,"0 == cleaner.CleanTarget(\"out1\")");
    testing::Test::Check
              (g_current_test,local_c8.cleaned_files_count_ == 2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
               ,0x10d,"2 == cleaner.cleaned_files_count()");
    testing::Test::Check
              (g_current_test,
               (this->super_CleanTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
               _M_node_count == 2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
               ,0x10e,"2u == fs_.files_removed_.size()");
    Cleaner::~Cleaner(&local_c8);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanDepFileOnCleanTarget) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n"
"  command = cc $in > $out\n"
"  depfile = $out.d\n"
"build out1: cc in1\n"));
  fs_.Create("out1", "");
  fs_.Create("out1.d", "");

  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner.CleanTarget("out1"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_EQ(2u, fs_.files_removed_.size());
}